

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscrete.cpp
# Opt level: O2

void __thiscall
MultiAgentDecisionProcessDiscrete::MultiAgentDecisionProcessDiscrete
          (MultiAgentDecisionProcessDiscrete *this,string *name,string *descr,string *pf)

{
  *(undefined ***)&this->field_0x200 = &PTR__MultiAgentDecisionProcessDiscreteInterface_00607690;
  MultiAgentDecisionProcess::MultiAgentDecisionProcess
            (&this->super_MultiAgentDecisionProcess,&PTR_construction_vtable_64__00607408,name,descr
             ,pf);
  *(undefined8 *)&this->super_MultiAgentDecisionProcess = 0x606f90;
  *(undefined8 *)&this->field_0x200 = 0x607288;
  MADPComponentDiscreteStates::MADPComponentDiscreteStates(&this->_m_S);
  MADPComponentDiscreteActions::MADPComponentDiscreteActions(&this->_m_A);
  MADPComponentDiscreteObservations::MADPComponentDiscreteObservations(&this->_m_O);
  this->_m_initialized = false;
  this->_m_sparse = false;
  this->_m_eventObservability = false;
  this->_m_p_tModel = (TransitionModelDiscrete *)0x0;
  this->_m_p_oModel = (ObservationModelDiscrete *)0x0;
  this->_m_falseNegativeObs = -1;
  return;
}

Assistant:

MultiAgentDecisionProcessDiscrete::MultiAgentDecisionProcessDiscrete( 
    const string &name, const string &descr, const string &pf) :
    MultiAgentDecisionProcessDiscreteInterface(),
    MultiAgentDecisionProcess(name, descr, pf)
{
    _m_initialized = false;
    _m_sparse = false;
    _m_eventObservability = false;
    _m_p_tModel = 0;
    _m_p_oModel = 0;
    _m_falseNegativeObs = -1;
}